

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_concat(lua_State *L,CallInfo *ci,int a,int b,int c)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  int *piVar5;
  StkId pTVar6;
  int iVar7;
  
  L->top = (StkId)((ci->u).c.k + (long)c * 0x10 + 0x10);
  luaV_concat(L,(c - b) + 1);
  pTVar3 = (ci->u).l.base;
  pTVar3[a].value_ = pTVar3[b].value_;
  uVar1 = pTVar3[b].tt_;
  pTVar3[a].tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     ((pGVar4 = pTVar3[a].value_.gc, (uVar1 & 0x7f) != (ushort)pGVar4->tt ||
      ((L != (lua_State *)0x0 && ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xb71,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
  }
  if (0 < L->l_G->GCdebt) {
    pTVar6 = pTVar3 + a + 1;
    if (a < b) {
      pTVar6 = pTVar3 + b;
    }
    L->top = pTVar6;
    luaC_step(L);
    L->top = ci->top;
  }
  piVar5 = *(int **)&L[-1].hookmask;
  iVar2 = *piVar5;
  iVar7 = iVar2 + -1;
  *piVar5 = iVar7;
  if (iVar7 == 0) {
    *piVar5 = iVar2;
    L->top = ci->top;
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xb72,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
}

Assistant:

void raviV_op_concat(lua_State *L, CallInfo *ci, int a, int b, int c) {
  StkId rb, ra;
  StkId base = ci->u.l.base;
  L->top = base + c + 1; /* mark the end of concat operands */
  Protect_base(luaV_concat(L, c - b + 1));
  ra = base + a; /* 'luav_concat' may invoke TMs and move the stack */
  rb = base + b;
  setobjs2s(L, ra, rb);
  checkGC_protectbase(L, (ra >= rb ? ra + 1 : rb));
  L->top = ci->top; /* restore top */
}